

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EratBig.cpp
# Opt level: O0

void __thiscall
primesieve::EratBig::crossOff
          (EratBig *this,Vector<unsigned_char,_std::allocator<unsigned_char>_> *sieve)

{
  SievingPrime **ppSVar1;
  Bucket *this_00;
  Bucket *this_01;
  SievingPrime **__last;
  EratBig *in_RSI;
  long in_RDI;
  SievingPrime *bucket;
  Bucket *processed;
  Bucket *bucket_1;
  Bucket *in_stack_ffffffffffffff98;
  MemoryPool *in_stack_ffffffffffffffa0;
  SievingPrime **in_stack_ffffffffffffffb0;
  SievingPrime *pSVar2;
  SievingPrime *in_stack_ffffffffffffffd8;
  Bucket *in_stack_ffffffffffffffe0;
  
  while (ppSVar1 = Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>::
                   operator[]((Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>
                               *)(in_RDI + 0x30),0), *ppSVar1 != (SievingPrime *)0x0) {
    ppSVar1 = Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>::
              operator[]((Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>
                          *)(in_RDI + 0x30),0);
    this_00 = Bucket::get(*ppSVar1);
    this_01 = this_00;
    ppSVar1 = Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>::
              operator[]((Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>
                          *)(in_RDI + 0x30),0);
    Bucket::setEnd(this_00,*ppSVar1);
    ppSVar1 = Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>::
              operator[]((Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>
                          *)(in_RDI + 0x30),0);
    *ppSVar1 = (SievingPrime *)0x0;
    while (this_01 != (Bucket *)0x0) {
      Vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                ((Vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RSI);
      Bucket::begin(this_01);
      Bucket::end(this_01);
      crossOff(in_RSI,(uint8_t *)this_01,(SievingPrime *)in_stack_ffffffffffffffe0,
               in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffffe0 = this_01;
      this_01 = Bucket::next(in_stack_ffffffffffffffe0);
      MemoryPool::freeBucket(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
  }
  ppSVar1 = Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>::
            operator[]((Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>
                        *)(in_RDI + 0x30),0);
  pSVar2 = *ppSVar1;
  ppSVar1 = Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>::begin
                      ((Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>
                        *)(in_RDI + 0x30));
  ppSVar1 = ppSVar1 + 1;
  __last = Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>::end
                     ((Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>
                       *)(in_RDI + 0x30));
  Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>::begin
            ((Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_> *)
             (in_RDI + 0x30));
  std::copy<primesieve::SievingPrime**,primesieve::SievingPrime**>
            (in_stack_ffffffffffffffb0,__last,ppSVar1);
  ppSVar1 = Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>::back
                      ((Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>
                        *)(in_RDI + 0x30));
  *ppSVar1 = pSVar2;
  return;
}

Assistant:

void EratBig::crossOff(Vector<uint8_t>& sieve)
{
  while (buckets_[0])
  {
    Bucket* bucket = Bucket::get(buckets_[0]);
    bucket->setEnd(buckets_[0]);
    buckets_[0] = nullptr;

    // Iterate over the buckets related
    // to the current segment.
    while (bucket)
    {
      crossOff(sieve.data(), bucket->begin(), bucket->end());
      Bucket* processed = bucket;
      bucket = bucket->next();
      memoryPool_->freeBucket(processed);
    }
  }

  // Move the bucket related to the next segment
  // to the 1st position so that it will be used
  // when sieving the next segment.
  auto* bucket = buckets_[0];
  std::copy(buckets_.begin() + 1, buckets_.end(), buckets_.begin());
  buckets_.back() = bucket;
}